

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O0

void __thiscall rsg::ValueRange::~ValueRange(ValueRange *this)

{
  ValueRange *this_local;
  
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~vector(&this->m_max);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~vector(&this->m_min);
  VariableType::~VariableType(&this->m_type);
  return;
}

Assistant:

ValueRange::~ValueRange (void)
{
}